

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult cmCMakePresetsGraphInternal::PresetBoolHelper(bool *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  Value *value_local;
  bool *out_local;
  
  if (PresetBoolHelper(bool&,Json::Value_const*)::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&PresetBoolHelper(bool&,Json::Value_const*)::helper);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Bool
                (&PresetBoolHelper::helper,READ_OK,INVALID_PRESET,false);
      __cxa_atexit(std::function<cmCMakePresetsGraph::ReadFileResult_(bool_&,_const_Json::Value_*)>
                   ::~function,&PresetBoolHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetBoolHelper(bool&,Json::Value_const*)::helper);
    }
  }
  RVar2 = std::function<cmCMakePresetsGraph::ReadFileResult_(bool_&,_const_Json::Value_*)>::
          operator()(&PresetBoolHelper::helper,out,value);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetBoolHelper(bool& out,
                                                     const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Bool(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET);

  return helper(out, value);
}